

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O1

Vec_Ptr_t * Llb_ManCutMap(Aig_Man_t *p,Vec_Ptr_t *vResult,Vec_Ptr_t *vSupps)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  void **ppvVar5;
  uint uVar6;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  int *piVar9;
  void *pvVar10;
  void *pvVar11;
  Vec_Ptr_t *pVVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  void *pvVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  char *__format;
  int iVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar12;
  
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  ppvVar8 = (void **)malloc(800);
  pVVar7->pArray = ppvVar8;
  if (0 < vResult->nSize) {
    lVar25 = 0;
    do {
      pvVar11 = vResult->pArray[lVar25];
      iVar20 = p->vObjs->nSize;
      piVar9 = (int *)malloc(0x10);
      iVar21 = iVar20;
      if (iVar20 - 1U < 0xf) {
        iVar21 = 0x10;
      }
      piVar9[1] = 0;
      *piVar9 = iVar21;
      if (iVar21 == 0) {
        pvVar10 = (void *)0x0;
      }
      else {
        pvVar10 = malloc((long)iVar21 << 2);
      }
      *(void **)(piVar9 + 2) = pvVar10;
      piVar9[1] = iVar20;
      if (pvVar10 != (void *)0x0) {
        memset(pvVar10,0,(long)iVar20 << 2);
      }
      if (0 < *(int *)((long)pvVar11 + 4)) {
        lVar19 = *(long *)((long)pvVar11 + 8);
        lVar15 = 0;
        do {
          piVar4 = *(int **)(lVar19 + lVar15 * 8);
          if (((piVar4[6] & 7U) != 2) || (p->nTruePis <= *piVar4)) {
            iVar20 = piVar4[9];
            if (((long)iVar20 < 0) || (piVar9[1] <= iVar20)) goto LAB_008333b4;
            *(undefined4 *)((long)pvVar10 + (long)iVar20 * 4) = 1;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < *(int *)((long)pvVar11 + 4));
      }
      uVar6 = pVVar7->nSize;
      uVar1 = pVVar7->nCap;
      if (uVar6 == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (pVVar7->pArray == (void **)0x0) {
            ppvVar8 = (void **)malloc(0x80);
          }
          else {
            ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
          }
          iVar20 = 0x10;
        }
        else {
          iVar20 = uVar1 * 2;
          if (iVar20 <= (int)uVar1) goto LAB_00832d92;
          if (pVVar7->pArray == (void **)0x0) {
            ppvVar8 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar1 << 4);
          }
        }
        pVVar7->pArray = ppvVar8;
        pVVar7->nCap = iVar20;
      }
LAB_00832d92:
      pVVar7->nSize = uVar6 + 1;
      pVVar7->pArray[(int)uVar6] = piVar9;
      lVar25 = lVar25 + 1;
    } while (lVar25 < vResult->nSize);
  }
  iVar20 = p->vObjs->nSize;
  piVar9 = (int *)malloc(0x10);
  iVar21 = 0x10;
  if (0xe < iVar20 - 1U) {
    iVar21 = iVar20;
  }
  piVar9[1] = 0;
  *piVar9 = iVar21;
  if (iVar21 == 0) {
    pvVar11 = (void *)0x0;
  }
  else {
    pvVar11 = malloc((long)iVar21 << 2);
  }
  *(void **)(piVar9 + 2) = pvVar11;
  piVar9[1] = iVar20;
  if (pvVar11 != (void *)0x0) {
    memset(pvVar11,0,(long)iVar20 << 2);
  }
  uVar6 = pVVar7->nCap;
  uVar1 = pVVar7->nSize;
  uVar24 = (ulong)uVar1;
  if (uVar1 == uVar6) {
    if ((int)uVar6 < 0x10) {
      if (pVVar7->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc(0x80);
      }
      else {
        ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
      }
      iVar20 = 0x10;
    }
    else {
      iVar20 = uVar6 * 2;
      if (iVar20 <= (int)uVar6) goto LAB_00832e92;
      if (pVVar7->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc((ulong)uVar6 << 4);
      }
      else {
        ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar6 << 4);
      }
    }
    pVVar7->pArray = ppvVar8;
    pVVar7->nCap = iVar20;
  }
LAB_00832e92:
  ppvVar8 = pVVar7->pArray;
  uVar6 = uVar1 + 1;
  uVar12 = (ulong)uVar6;
  pVVar7->nSize = uVar6;
  ppvVar8[(int)uVar1] = piVar9;
  if (uVar1 != vResult->nSize) {
    __assert_fail("Vec_PtrSize(vMaps) == Vec_PtrSize(vResult)+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Flow.c"
                  ,0x72,"Vec_Ptr_t *Llb_ManCutMap(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  iVar20 = p->nTruePis;
  uVar26 = (ulong)iVar20;
  pvVar11 = malloc(uVar26 * 4);
  pvVar10 = malloc(uVar26 * 4);
  if (0 < (long)uVar26) {
    uVar18 = p->vCis->nSize;
    uVar16 = 0;
    uVar14 = (ulong)uVar18;
    if ((int)uVar18 < 1) {
      uVar14 = uVar16;
    }
    do {
      if (uVar14 == uVar16) goto LAB_008333f2;
      *(undefined4 *)((long)pvVar10 + uVar16 * 4) = 0xffffffff;
      *(undefined4 *)((long)pvVar11 + uVar16 * 4) = 0xffffffff;
      uVar16 = uVar16 + 1;
    } while (uVar26 != uVar16);
  }
  iVar21 = vSupps->nSize;
  if (0 < (long)iVar21) {
    ppvVar5 = vSupps->pArray;
    lVar25 = 0;
    do {
      lVar19 = (long)*(int *)((long)ppvVar5[lVar25] + 4);
      if (0 < lVar19) {
        lVar15 = *(long *)((long)ppvVar5[lVar25] + 8);
        lVar22 = 0;
        do {
          piVar9 = *(int **)(lVar15 + lVar22 * 8);
          if (((piVar9[6] & 7U) == 2) && (*piVar9 < iVar20)) {
            lVar23 = (long)*piVar9;
            if (*(int *)((long)pvVar11 + lVar23 * 4) == -1) {
              *(int *)((long)pvVar11 + lVar23 * 4) = (int)lVar25;
            }
            *(int *)((long)pvVar10 + lVar23 * 4) = (int)lVar25;
          }
          lVar22 = lVar22 + 1;
        } while (lVar19 != lVar22);
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 != iVar21);
  }
  lVar25 = (long)p->nRegs;
  if (0 < lVar25) {
    pVVar13 = p->vCos;
    uVar18 = p->nTruePos;
    uVar26 = (ulong)uVar18;
    do {
      if (((int)uVar18 < 0) || (pVVar13->nSize <= (int)uVar26)) goto LAB_008333f2;
      piVar9 = (int *)(*(ulong *)((long)pVVar13->pArray[uVar26] + 8) & 0xfffffffffffffffe);
      if (((piVar9[6] & 7U) == 2) && (*piVar9 < iVar20)) {
        *(uint *)((long)pvVar10 + (long)*piVar9 * 4) = uVar1;
      }
      uVar26 = uVar26 + 1;
      lVar25 = lVar25 + -1;
    } while (lVar25 != 0);
  }
  if (0 < p->nTruePis) {
    pVVar13 = p->vCis;
    lVar25 = 0;
    do {
      if (pVVar13->nSize <= lVar25) goto LAB_008333f2;
      uVar18 = *(uint *)((long)pvVar11 + lVar25 * 4);
      uVar26 = (ulong)uVar18;
      if (uVar26 != 0xffffffff) {
        pvVar17 = pVVar13->pArray[lVar25];
        uVar2 = *(uint *)((long)pvVar10 + lVar25 * 4);
        if (uVar18 == uVar2) {
          if (((int)uVar18 < 0) || ((int)uVar1 < (int)uVar18)) goto LAB_008333f2;
          iVar20 = *(int *)((long)pvVar17 + 0x24);
          if (((long)iVar20 < 0) || (*(int *)((long)ppvVar8[uVar26] + 4) <= iVar20)) {
LAB_008333b4:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(undefined4 *)(*(long *)((long)ppvVar8[uVar26] + 8) + (long)iVar20 * 4) = 2;
        }
        else if ((int)uVar18 <= (int)uVar2) {
          iVar20 = uVar18 - 1;
          do {
            if (((int)uVar18 < 0) || ((int)uVar1 < (int)uVar26)) goto LAB_008333f2;
            iVar21 = *(int *)((long)pvVar17 + 0x24);
            if (((long)iVar21 < 0) || (*(int *)((long)ppvVar8[uVar26] + 4) <= iVar21))
            goto LAB_008333b4;
            *(undefined4 *)(*(long *)((long)ppvVar8[uVar26] + 8) + (long)iVar21 * 4) = 1;
            uVar26 = uVar26 + 1;
            iVar20 = iVar20 + 1;
          } while (iVar20 < (int)uVar2);
        }
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 < p->nTruePis);
  }
  if (pvVar11 != (void *)0x0) {
    free(pvVar11);
  }
  if (pvVar10 != (void *)0x0) {
    free(pvVar10);
  }
  uVar18 = p->nRegs;
  printf("%d ",(ulong)uVar18);
  if (0 < (int)uVar1) {
    uVar26 = 1;
    do {
      pvVar11 = ppvVar8[uVar26 - 1];
      pvVar10 = ppvVar8[uVar26];
      if (uVar26 == uVar24) {
        pvVar17 = (void *)0x0;
      }
      else {
        if (uVar24 <= uVar26) {
LAB_008333f2:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar17 = ppvVar8[uVar26 + 1];
      }
      lVar25 = (long)p->vObjs->nSize;
      if (lVar25 < 1) {
        iVar21 = 0;
        iVar20 = 0;
      }
      else {
        lVar19 = 0;
        iVar20 = 0;
        iVar21 = 0;
        do {
          piVar9 = (int *)p->vObjs->pArray[lVar19];
          if (piVar9 != (int *)0x0) {
            if (((piVar9[6] & 7U) == 2) && (*piVar9 < p->nTruePis)) {
              if (*(int *)((long)pvVar11 + 4) <= lVar19) goto LAB_008333d3;
              if (*(int *)(*(long *)((long)pvVar11 + 8) + lVar19 * 4) == 0) {
                if (*(int *)((long)pvVar10 + 4) <= lVar19) goto LAB_008333d3;
                iVar21 = iVar21 + (uint)(*(int *)(*(long *)((long)pvVar10 + 8) + lVar19 * 4) == 1);
              }
              if (*(int *)((long)pvVar10 + 4) <= lVar19) goto LAB_008333d3;
              if (*(int *)(*(long *)((long)pvVar10 + 8) + lVar19 * 4) == 1) {
                if (pvVar17 != (void *)0x0) {
                  if (*(int *)((long)pvVar17 + 4) <= lVar19) goto LAB_008333d3;
                  if (*(int *)(*(long *)((long)pvVar17 + 8) + lVar19 * 4) != 0) goto LAB_00833216;
                }
                iVar20 = iVar20 + 1;
              }
            }
            else {
              if (*(int *)((long)pvVar11 + 4) <= lVar19) goto LAB_008333d3;
              iVar3 = *(int *)(*(long *)((long)pvVar11 + 8) + lVar19 * 4);
              if (iVar3 == 0) {
                if (*(int *)((long)pvVar10 + 4) <= lVar19) goto LAB_008333d3;
                iVar21 = iVar21 + (uint)(*(int *)(*(long *)((long)pvVar10 + 8) + lVar19 * 4) == 1);
              }
              if (iVar3 == 1) {
                if (*(int *)((long)pvVar10 + 4) <= lVar19) goto LAB_008333d3;
                iVar20 = iVar20 + (uint)(*(int *)(*(long *)((long)pvVar10 + 8) + lVar19 * 4) == 0);
              }
            }
          }
LAB_00833216:
          lVar19 = lVar19 + 1;
        } while (lVar25 != lVar19);
      }
      uVar18 = (uVar18 + iVar21) - iVar20;
      printf("%d=%d ",uVar26 & 0xffffffff,(ulong)uVar18);
      uVar26 = uVar26 + 1;
    } while (uVar26 != uVar24 + 1);
  }
  putchar(10);
  pVVar13 = p->vObjs;
  if (0 < pVVar13->nSize) {
    uVar24 = 0;
    do {
      piVar9 = (int *)pVVar13->pArray[uVar24];
      if ((piVar9 != (int *)0x0) &&
         ((((uint)*(undefined8 *)(piVar9 + 6) & 7) == 2 ||
          (0xfffffffd < ((uint)*(undefined8 *)(piVar9 + 6) & 7) - 7)))) {
        if ((int)uVar1 < 0) {
          uVar26 = 0;
        }
        else {
          uVar14 = 0;
          do {
            if ((long)*(int *)((long)ppvVar8[uVar14] + 4) <= (long)uVar24) goto LAB_008333d3;
            uVar26 = uVar14;
          } while ((*(int *)(*(long *)((long)ppvVar8[uVar14] + 8) + uVar24 * 4) == 0) &&
                  (uVar14 = uVar14 + 1, uVar26 = uVar12, uVar12 != uVar14));
        }
        if ((uint)uVar26 != uVar6) {
          printf("Obj = %4d : ",uVar24 & 0xffffffff);
          if (((((uint)*(undefined8 *)(piVar9 + 6) & 7) == 2) &&
              ((__format = "pi  ", *piVar9 < p->nTruePis ||
               (__format = "lo  ", p->nTruePis <= *piVar9)))) ||
             (__format = "and ", 0xfffffffd < ((uint)*(undefined8 *)(piVar9 + 6) & 7) - 7)) {
            printf(__format);
          }
          if (-1 < (int)uVar1) {
            uVar26 = 0;
            do {
              if ((long)*(int *)((long)ppvVar8[uVar26] + 4) <= (long)uVar24) {
LAB_008333d3:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              printf("%d",(ulong)*(uint *)(*(long *)((long)ppvVar8[uVar26] + 8) + uVar24 * 4));
              uVar26 = uVar26 + 1;
            } while (uVar12 != uVar26);
          }
          putchar(10);
        }
      }
      uVar24 = uVar24 + 1;
      pVVar13 = p->vObjs;
    } while ((long)uVar24 < (long)pVVar13->nSize);
  }
  return pVVar7;
}

Assistant:

Vec_Ptr_t * Llb_ManCutMap( Aig_Man_t * p, Vec_Ptr_t * vResult, Vec_Ptr_t * vSupps )
{
    int fShowMatrix = 1;
    Vec_Ptr_t * vMaps, * vOne;
    Vec_Int_t * vMap, * vPrev, * vNext;
    Aig_Obj_t * pObj;
    int * piFirst, * piLast;
    int i, k, CounterPlus, CounterMinus, Counter;

    vMaps = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Vec_Ptr_t *, vResult, vOne, i )
    {
        vMap = Vec_IntStart( Aig_ManObjNumMax(p) );
        Vec_PtrForEachEntry( Aig_Obj_t *, vOne, pObj, k )
        {
            if ( !Saig_ObjIsPi(p, pObj) )
                Vec_IntWriteEntry( vMap, pObj->Id, 1 );
//            else
//printf( "*" );
//printf( "%d ", pObj->Id );
        }
        Vec_PtrPush( vMaps, vMap );
//printf( "\n" );
    }
    Vec_PtrPush( vMaps, Vec_IntStart( Aig_ManObjNumMax(p) ) );
    assert( Vec_PtrSize(vMaps) == Vec_PtrSize(vResult)+1 );

    // collect the first and last PIs
    piFirst = ABC_ALLOC( int, Saig_ManPiNum(p) );
    piLast  = ABC_ALLOC( int, Saig_ManPiNum(p) );
    Saig_ManForEachPi( p, pObj, i )
        piFirst[i] = piLast[i] = -1;
    Vec_PtrForEachEntry( Vec_Ptr_t *, vSupps, vOne, i )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, vOne, pObj, k )
        {
            if ( !Saig_ObjIsPi(p, pObj) )
                continue;
            if ( piFirst[Aig_ObjCioId(pObj)] == -1 )
                 piFirst[Aig_ObjCioId(pObj)] = i;
            piLast[Aig_ObjCioId(pObj)] = i;
        }
    }
    // PIs feeding into the flops should be extended to the last frame
    Saig_ManForEachLi( p, pObj, i )
    {
        if ( !Saig_ObjIsPi(p, Aig_ObjFanin0(pObj)) )
            continue;
        piLast[Aig_ObjCioId(Aig_ObjFanin0(pObj))] = Vec_PtrSize(vMaps)-1;
    }

    // set the PI map
    Saig_ManForEachPi( p, pObj, i )
    {
        if ( piFirst[i] == -1 )
            continue;
        if ( piFirst[i] == piLast[i] )
        {
            vMap = (Vec_Int_t *)Vec_PtrEntry( vMaps, piFirst[i] );
            Vec_IntWriteEntry( vMap, pObj->Id, 2 );
            continue;
        }

        // set support for all in between        
        for ( k = piFirst[i]; k <= piLast[i]; k++ )
        {
            vMap = (Vec_Int_t *)Vec_PtrEntry( vMaps, k );
            Vec_IntWriteEntry( vMap, pObj->Id, 1 );
        }
    }
    ABC_FREE( piFirst );
    ABC_FREE( piLast );


    // find all that will appear here
    Counter = Aig_ManRegNum(p);
    printf( "%d ", Counter );
    Vec_PtrForEachEntryStart( Vec_Int_t *, vMaps, vMap, i, 1 )
    {
        vPrev = (Vec_Int_t *)Vec_PtrEntry( vMaps, i-1 );
        vNext = (i == Vec_PtrSize(vMaps)-1)? NULL: (Vec_Int_t *)Vec_PtrEntry( vMaps, i+1 );

        CounterPlus = CounterMinus = 0;
        Aig_ManForEachObj( p, pObj, k )
        {
            if ( Saig_ObjIsPi(p, pObj) )
            {
                if ( Vec_IntEntry(vPrev, k) == 0 && Vec_IntEntry(vMap, k) == 1 )
                    CounterPlus++;
                if ( Vec_IntEntry(vMap, k) == 1 && (vNext == NULL || Vec_IntEntry(vNext, k) == 0) )
                    CounterMinus++;
            }
            else
            {
                if ( Vec_IntEntry(vPrev, k) == 0 && Vec_IntEntry(vMap, k) == 1 )
                    CounterPlus++;
                if ( Vec_IntEntry(vPrev, k) == 1 && Vec_IntEntry(vMap, k) == 0 )
                    CounterMinus++;
            }
        }
        Counter = Counter + CounterPlus - CounterMinus;
        printf( "%d=%d ", i, Counter );
    }
    printf( "\n" );

    if ( !fShowMatrix )
        return vMaps;
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !Aig_ObjIsCi(pObj) && !Aig_ObjIsNode(pObj) )
            continue;
        Vec_PtrForEachEntry( Vec_Int_t *, vMaps, vMap, k )
            if ( Vec_IntEntry(vMap, i) )
                break;
        if ( k == Vec_PtrSize(vMaps) )
            continue;
        printf( "Obj = %4d : ", i );
        if ( Saig_ObjIsPi(p,pObj) )
            printf( "pi  " );
        else if ( Saig_ObjIsLo(p,pObj) )
            printf( "lo  " );
        else if ( Aig_ObjIsNode(pObj) )
            printf( "and " );

        Vec_PtrForEachEntry( Vec_Int_t *, vMaps, vMap, k )
            printf( "%d", Vec_IntEntry(vMap, i) );
        printf( "\n" );
    }
    return vMaps;
}